

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeLeave(Vdbe *p)

{
  uint uVar1;
  ulong uVar2;
  Btree **ppBVar3;
  ulong uVar4;
  
  if (p->lockMask != 0) {
    uVar1 = p->db->nDb;
    uVar2 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar2;
    }
    ppBVar3 = &p->db->aDb->pBt;
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      if (((uVar2 != 1) && ((p->lockMask >> ((uint)uVar2 & 0x1f) & 1) != 0)) &&
         (*ppBVar3 != (Btree *)0x0)) {
        sqlite3BtreeLeave(*ppBVar3);
      }
      ppBVar3 = ppBVar3 + 4;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeLeave(Vdbe *p){
  int i;
  sqlite3 *db;
  Db *aDb;
  int nDb;
  if( DbMaskAllZero(p->lockMask) ) return;  /* The common case */
  db = p->db;
  aDb = db->aDb;
  nDb = db->nDb;
  for(i=0; i<nDb; i++){
    if( i!=1 && DbMaskTest(p->lockMask,i) && ALWAYS(aDb[i].pBt!=0) ){
      sqlite3BtreeLeave(aDb[i].pBt);
    }
  }
}